

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O2

int dlep_reader_lid_tlv(oonf_layer2_neigh_key *key,dlep_session *session,dlep_parser_value *value)

{
  if ((value == (dlep_parser_value *)0x0) &&
     (value = dlep_session_get_tlv_value(session,0x15), value == (dlep_parser_value *)0x0)) {
    return -1;
  }
  memcpy(key->link_id,(session->parser).tlv_ptr + value->index,(ulong)value->length);
  key->link_id_length = (uint8_t)value->length;
  return 0;
}

Assistant:

int
dlep_reader_lid_tlv(struct oonf_layer2_neigh_key *key, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_LID_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  memcpy(key->link_id, ptr, value->length);
  key->link_id_length = value->length;
  return 0;
}